

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void match_ctx_init(match_ctx *ctx,membuf *inbuf,int max_len,int max_offset,int use_imprecise_rle)

{
  size_t __nmemb;
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uchar *puVar4;
  matchp pmVar5;
  pre_calc (*papVar6) [1];
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  uint *puVar9;
  match_node *pmVar10;
  match_node *pmVar11;
  long lVar12;
  ulong uVar13;
  match_node *pmVar14;
  uint uVar15;
  unsigned_short uVar16;
  int iVar17;
  uint *puVar18;
  int iVar19;
  int offset;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  uint local_5c;
  matchp local_50;
  matchp local_40;
  match_node *local_38;
  
  uVar22 = inbuf->len;
  uVar21 = (ulong)uVar22;
  puVar4 = (uchar *)inbuf->buf;
  __nmemb = (long)(int)uVar22 + 1;
  papVar6 = (pre_calc (*) [1])calloc(__nmemb,0x10);
  ctx->info = papVar6;
  puVar7 = (unsigned_short *)calloc(__nmemb,2);
  ctx->rle = puVar7;
  puVar8 = (unsigned_short *)calloc(__nmemb,2);
  ctx->rle_r = puVar8;
  ctx->m_pool[0].chunk_size = 0x10;
  ctx->m_pool[0].chunk = -1;
  ctx->m_pool[0].chunk_pos = 0x1ffff0;
  ctx->m_pool[0].chunk_max = 0x1ffff0;
  ctx->max_offset = max_offset;
  ctx->max_len = max_len;
  ctx->buf = puVar4;
  ctx->len = uVar22;
  for (lVar12 = 1; lVar12 < (int)uVar22; lVar12 = lVar12 + 1) {
    if (puVar4[lVar12] == puVar4[lVar12 + -1]) {
      uVar16 = puVar7[lVar12 + -1] + 1;
    }
    else {
      uVar16 = 0;
    }
    puVar7[lVar12] = uVar16;
  }
  for (lVar12 = 0; uVar24 = (ulong)(uVar22 - 2) + lVar12, -1 < (int)uVar24; lVar12 = lVar12 + -1) {
    uVar24 = uVar24 & 0xffffffff;
    if (puVar7[uVar24] < puVar7[(ulong)(uVar22 - 1) + lVar12]) {
      uVar16 = puVar8[(ulong)(uVar22 - 1) + lVar12] + 1;
    }
    else {
      uVar16 = 0;
    }
    puVar8[uVar24] = uVar16;
  }
  uVar24 = 0;
  if (0 < (int)uVar22) {
    uVar24 = uVar21;
  }
  for (uVar22 = 0; uVar22 != 0x100; uVar22 = uVar22 + 1) {
    memset(match_ctx_init::rle_map,0,0x10000);
    lVar12 = 0;
    puVar18 = (uint *)0x0;
    for (uVar20 = 0; uVar24 != uVar20; uVar20 = uVar20 + 1) {
      if (((uVar22 == puVar4[uVar20]) &&
          ((uVar13 = (ulong)ctx->rle[uVar20], match_ctx_init::rle_map[uVar13] != '\0' ||
           (ctx->rle_r[uVar20] < 0x11)))) &&
         ((use_imprecise_rle == 0 || ((uVar13 == 0 || (ctx->rle_r[uVar20] == 0)))))) {
        puVar9 = (uint *)chunkpool_malloc(ctx->m_pool);
        *puVar9 = (uint)uVar20;
        puVar9[2] = 0;
        puVar9[3] = 0;
        match_ctx_init::rle_map[uVar13] = '\x01';
        if (~LOG_FATAL < G_log_level) {
          G_log_log_level = LOG_DUMP;
          log_log_default("0) c = %d, added np idx %d -> %d\n",(ulong)uVar22,uVar20 & 0xffffffff,0);
        }
        if (puVar18 != (uint *)0x0) {
          if (~LOG_FATAL < G_log_level) {
            G_log_log_level = LOG_DUMP;
            log_log_default("1) c = %d, pointed np idx %d -> %d\n",(ulong)uVar22,(ulong)*puVar18,
                            uVar20 & 0xffffffff);
          }
          *(uint **)(puVar18 + 2) = puVar9;
        }
        *(uint **)((long)&(*ctx->info)[0].single + lVar12) = puVar9;
        puVar18 = puVar9;
      }
      lVar12 = lVar12 + 0x10;
    }
    memset(match_ctx_init::rle_map,0,0x10000);
    uVar20 = uVar21;
    pmVar14 = (match_node *)0x0;
    while (0 < (int)uVar20) {
      uVar20 = uVar20 - 1;
      uVar13 = uVar20 & 0xffffffff;
      if (uVar22 == puVar4[uVar13]) {
        pmVar11 = ctx->info[uVar13][0].single;
        if ((((pmVar11 == (match_node *)0x0) && (pmVar11 = pmVar14, (ulong)ctx->rle_r[uVar13] != 0))
            && (match_ctx_init::rle_map[ctx->rle_r[uVar13]] != '\0')) &&
           (pmVar14 != (match_node *)0x0)) {
          pmVar10 = (match_node *)chunkpool_malloc(ctx->m_pool);
          pmVar10->index = (int)uVar20;
          pmVar10->next = pmVar14;
          ctx->info[uVar13][0].single = pmVar10;
          if (~LOG_ERROR < G_log_level) {
            G_log_log_level = LOG_DEBUG;
            log_log_default("2) c = %d, added np idx %d -> %d\n",(ulong)uVar22,uVar20 & 0xffffffff,
                            (ulong)(uint)pmVar14->index);
          }
        }
        pmVar14 = pmVar11;
        if (ctx->rle_r[uVar13] == 0) {
          match_ctx_init::rle_map[(ushort)(ctx->rle[uVar13] + 1)] = '\x01';
        }
      }
    }
  }
  do {
    iVar17 = (int)uVar21;
    if (iVar17 < 1) {
      return;
    }
    uVar21 = uVar21 - 1;
    puVar4 = ctx->buf;
    if (~LOG_FATAL < G_log_level) {
      G_log_log_level = LOG_DUMP;
      uVar24 = uVar21 & 0xffffffff;
      log_log_default("index %d, char \'%c\', rle %d, rle_r %d\n",uVar21 & 0xffffffff,
                      (ulong)puVar4[uVar24],(ulong)ctx->rle[uVar24],(ulong)ctx->rle_r[uVar24]);
    }
    local_50 = (matchp)chunkpool_malloc(ctx->m_pool);
    local_50->offset = 0;
    local_50->len = 1;
    local_50->next = (match *)0x0;
    pmVar14 = ctx->info[uVar21 & 0xffffffff][0].single;
    local_40 = local_50;
    if (pmVar14 != (match_node *)0x0) goto LAB_0010e199;
    for (pmVar14 = (match_node *)0x0;
        (pmVar14 != (match_node *)0x0 &&
        (iVar19 = (int)uVar21, pmVar14->index <= ctx->max_offset + iVar19)); pmVar14 = pmVar14->next
        ) {
      if (~LOG_FATAL < G_log_level) {
        G_log_log_level = LOG_DUMP;
        log_log_default("find lengths for index %d to index %d\n",uVar21 & 0xffffffff,
                        (ulong)(uint)pmVar14->index);
      }
      local_5c = 0;
      if (local_50->offset != 0) {
        local_5c = (uint)local_50->len;
      }
      if (~LOG_FATAL < G_log_level) {
        G_log_log_level = LOG_DUMP;
        log_log_default("0) comparing with current best [%d] off %d len %d\n",uVar21 & 0xffffffff,
                        (ulong)local_50->offset,(ulong)local_5c);
      }
      iVar3 = pmVar14->index;
      offset = iVar3 - iVar19;
      uVar15 = iVar17 - local_5c;
      local_38 = pmVar14;
      for (uVar22 = local_5c; 1 < (int)uVar22; uVar22 = uVar22 - (uVar23 + 1)) {
        pmVar14 = local_38;
        if (puVar4[(int)uVar15] != puVar4[(int)(uVar15 + offset)]) goto LAB_0010e199;
        uVar1 = ctx->rle_r[(int)uVar15];
        uVar2 = ctx->rle_r[(int)(uVar15 + offset)];
        if (uVar1 < uVar2) {
          uVar2 = uVar1;
        }
        uVar23 = (uint)uVar2;
        if (~LOG_FATAL < G_log_level) {
          G_log_log_level = LOG_DUMP;
          log_log_default("1) compared sucesssfully [%d] %d %d\n",uVar21,(ulong)uVar15,
                          (ulong)(uVar23 + uVar15));
        }
        uVar15 = uVar15 + uVar23 + 1;
      }
      if (offset < 0x11) {
        local_50 = (matchp)chunkpool_malloc(ctx->m_pool);
        local_50->len = 1;
        local_50->offset = (unsigned_short)offset;
        local_50->next = local_40;
        local_40 = local_50;
      }
      uVar24 = (ulong)(int)(iVar19 - local_5c);
      uVar15 = iVar3 - local_5c;
      uVar22 = local_5c;
      while( true ) {
        iVar19 = ctx->max_len;
        bVar25 = -1 < (long)uVar24;
        if ((iVar19 < (int)uVar22) || ((long)uVar24 < 0)) goto LAB_0010e156;
        if (puVar4[uVar24] != puVar4[(int)uVar15]) break;
        if (~LOG_FATAL < G_log_level) {
          G_log_log_level = LOG_DUMP;
          log_log_default("2) compared sucesssfully [%d] %d %d\n",uVar21,uVar24 & 0xffffffff,
                          (ulong)uVar15);
        }
        uVar22 = uVar22 + 1;
        uVar24 = uVar24 - 1;
        uVar15 = uVar15 - 1;
      }
      bVar25 = true;
LAB_0010e156:
      if (local_5c < uVar22) {
        local_50 = match_new(ctx,&local_40,uVar22,offset);
        iVar19 = ctx->max_len;
      }
      pmVar14 = local_38;
      if (!(bool)((int)uVar22 <= iVar19 & bVar25)) break;
LAB_0010e199:
    }
    if (~LOG_ERROR < G_log_level) {
      G_log_log_level = LOG_DEBUG;
      log_log_default("adding matches for index %d to cache\n",uVar21 & 0xffffffff);
    }
    pmVar5 = local_40;
    dump_matches(0x1e,local_40);
    ctx->info[uVar21 & 0xffffffff][0].cache = pmVar5;
  } while( true );
}

Assistant:

void match_ctx_init(match_ctx ctx,         /* IN/OUT */
                    struct membuf *inbuf,  /* IN */
                    int max_len,           /* IN */
                    int max_offset,        /* IN */
                    int use_imprecise_rle) /* IN */
{
    struct match_node *np;

    int buf_len = membuf_memlen(inbuf);
    const unsigned char *buf = membuf_get(inbuf);

    int c, i;
    int val;

    ctx->info = calloc(buf_len + 1, sizeof(*ctx->info));
    ctx->rle = calloc(buf_len + 1, sizeof(*ctx->rle));
    ctx->rle_r = calloc(buf_len + 1, sizeof(*ctx->rle_r));

    chunkpool_init(ctx->m_pool, sizeof(match));

    ctx->max_offset = max_offset;
    ctx->max_len = max_len;

    ctx->buf = buf;
    ctx->len = buf_len;

    val = buf[0];
    for (i = 1; i < buf_len; ++i)
    {
        if (buf[i] == val)
        {
            int len = ctx->rle[i - 1] + 1;
            if(len > 65535)
            {
                len = 0;
            }
            ctx->rle[i] = len;
        } else
        {
            ctx->rle[i] = 0;
        }
        val = buf[i];
    }

    for (i = buf_len - 2; i >= 0; --i)
    {
        if (ctx->rle[i] < ctx->rle[i + 1])
        {
            ctx->rle_r[i] = ctx->rle_r[i + 1] + 1;
        } else
        {
            ctx->rle_r[i] = 0;
        }
    }

    /* add extra nodes to rle sequences */
    for(c = 0; c < 256; ++c)
    {
        static char rle_map[65536];
        struct match_node *prev_np;
        unsigned short int rle_len;

        /* for each possible rle char */
        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = 0; i < buf_len; ++i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle[i];
            if(!rle_map[rle_len] && ctx->rle_r[i] > 16)
            {
                /* no previous lengths and not our primary length*/
                continue;
            }

            if (use_imprecise_rle &&
                ctx->rle_r[i] != 0 && ctx->rle[i] != 0)
            {
                continue;
            }

            np = chunkpool_malloc(ctx->m_pool);
            np->index = i;
            np->next = NULL;
            rle_map[rle_len] = 1;

            LOG(LOG_DUMP, ("0) c = %d, added np idx %d -> %d\n", c, i, 0));

            /* if we have a previous entry, let's chain it together */
            if(prev_np != NULL)
            {
                LOG(LOG_DUMP, ("1) c = %d, pointed np idx %d -> %d\n",
                                c, prev_np->index, i));
                prev_np->next = np;
            }

            ctx->info[i]->single = np;
            prev_np = np;
        }

        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = buf_len - 1; i >= 0; --i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle_r[i];
            np = ctx->info[i]->single;
            if(np == NULL)
            {
                if(rle_map[rle_len] && prev_np != NULL && rle_len > 0)
                {
                    np = chunkpool_malloc(ctx->m_pool);
                    np->index = i;
                    np->next = prev_np;
                    ctx->info[i]->single = np;

                    LOG(LOG_DEBUG, ("2) c = %d, added np idx %d -> %d\n",
                                    c, i, prev_np->index));
                }
            }
            else
            {
                prev_np = np;
            }

            if(ctx->rle_r[i] > 0)
            {
                continue;
            }
            rle_len = ctx->rle[i] + 1;
            rle_map[rle_len] = 1;
        }
    }


    for (i = buf_len - 1; i >= 0; --i)
    {
        const_matchp matches;

        /* let's populate the cache */
        matches = matches_calc(ctx, i);

        /* add to cache */
        ctx->info[i]->cache = matches;

    }

}